

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68020_cpdbcc(void)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint in_EDI;
  uint uVar6;
  
  uVar2 = g_cpu_pc;
  if (((byte)g_cpu_type & 0x1c) != 0) {
    uVar3 = dasm_read_imm_16(in_EDI);
    uVar4 = dasm_read_imm_16(in_EDI);
    uVar5 = dasm_read_imm_16(in_EDI);
    uVar6 = g_cpu_ir >> 9;
    pcVar1 = g_cpcc[uVar3 & 0x3f];
    uVar3 = g_cpu_ir & 7;
    get_imm_str_s(1);
    sprintf(g_dasm_str,"%ddb%-4s D%d,%s; $%x (extension = $%x) (2-3)",(ulong)(uVar6 & 7),pcVar1,
            (ulong)uVar3,get_imm_str_s::str,
            (ulong)(((uint)(uVar5 < 0x8000) * 0x10000 + uVar2 + uVar5) - 0x10000),(ulong)uVar4);
    return;
  }
  if ((~g_cpu_ir & 0xf000) != 0) {
    d68000_illegal();
    return;
  }
  sprintf(g_dasm_str,"dc.w    $%04x; opcode 1111",(ulong)g_cpu_ir);
  return;
}

Assistant:

static void d68020_cpdbcc(void)
{
	uint extension1;
	uint extension2;
	uint new_pc = g_cpu_pc;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension1 = read_imm_16();
	extension2 = read_imm_16();
	new_pc += make_int_16(read_imm_16());
	sprintf(g_dasm_str, "%ddb%-4s D%d,%s; $%x (extension = $%x) (2-3)", (g_cpu_ir>>9)&7, g_cpcc[extension1&0x3f], g_cpu_ir&7, get_imm_str_s16(), new_pc, extension2);
}